

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_set_sent_dir(char *dir)

{
  int iVar1;
  char *pcVar2;
  char *tt;
  char *dir_local;
  
  if (transcription_filename != (char *)0x0) {
    __assert_fail("transcription_filename == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                  ,0x352,"int corpus_set_sent_dir(const char *)");
  }
  requires_sent = 1;
  pcVar2 = strrchr(dir,0x2c);
  if (pcVar2 == (char *)0x0) {
    is_flat[0] = 0;
  }
  else {
    iVar1 = strcmp(pcVar2 + 1,"FLAT");
    if (iVar1 == 0) {
      is_flat[0] = 1;
      *pcVar2 = '\0';
    }
    else {
      iVar1 = strcmp(pcVar2 + 1,"CTL");
      if (iVar1 == 0) {
        is_flat[0] = 0;
        *pcVar2 = '\0';
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                ,0x361,"Assuming \',\' in sent dir is part of a pathname\n");
        is_flat[0] = 0;
      }
    }
  }
  data_dir[0] = dir;
  return 0;
}

Assistant:

int
corpus_set_sent_dir(const char *dir)
{
    char *tt;

    assert(transcription_filename == NULL);

    requires_sent = TRUE;

    tt = strrchr(dir, ',');
    if (tt != NULL) {
	if (strcmp(tt+1, "FLAT") == 0) {
	    is_flat[DATA_TYPE_SENT] = TRUE;
	    *tt = '\0';
	}
	else if (strcmp(tt+1, "CTL") == 0) {
	    is_flat[DATA_TYPE_SENT] = FALSE;
	    *tt = '\0';
	}
	else {
	    E_INFO("Assuming ',' in sent dir is part of a pathname\n");
	    
	    is_flat[DATA_TYPE_SENT] = FALSE;
	}
    }
    else {
	is_flat[DATA_TYPE_SENT] = FALSE;
    }

    data_dir[DATA_TYPE_SENT] = dir;

    return S3_SUCCESS;
}